

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

ptrdiff_t __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::reMax
          (ClassArray<soplex::Nonzero<double>_> *this,int newMax,int newSize)

{
  double *pdVar1;
  double dVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  uint n;
  long lVar6;
  ptrdiff_t pVar7;
  Nonzero<double> *newMem;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    pVar7 = 0;
  }
  else {
    newMem = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&newMem,n);
    piVar3 = &newMem->idx;
    lVar6 = 0;
    for (uVar4 = 0; ((long)uVar4 < (long)newSize && ((long)uVar4 < (long)this->thesize));
        uVar4 = uVar4 + 1) {
      pdVar1 = (double *)((long)&this->data->val + lVar6);
      dVar2 = pdVar1[1];
      ((Nonzero<double> *)(piVar3 + -2))->val = *pdVar1;
      *(double *)piVar3 = dVar2;
      piVar3 = piVar3 + 4;
      lVar6 = lVar6 + 0x10;
    }
    uVar5 = (ulong)n;
    if (n < uVar4) {
      uVar5 = uVar4;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 - 1) {
      ((Nonzero<double> *)(piVar3 + -2))->val = 0.0;
      *piVar3 = 0;
      piVar3 = piVar3 + 4;
    }
    pVar7 = (long)newMem - (long)this->data;
    spx_free<soplex::Nonzero<double>*>(&this->data);
    this->data = newMem;
    this->themax = n;
    this->thesize = newSize;
  }
  return pVar7;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }